

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

const_reverse_iterator __thiscall qpdf::Array::crend(Array *this)

{
  bool bVar1;
  Array *in_RSI;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_40;
  QPDF_Array *local_20;
  QPDF_Array *a;
  Array *this_local;
  
  this_local = this;
  local_20 = BaseHandle::as<QPDF_Array>(&in_RSI->super_BaseHandle);
  if (local_20 == (QPDF_Array *)0x0) {
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
    ::reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                        *)this);
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_20);
    if (bVar1) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&in_RSI->sp_elements);
      if (!bVar1) {
        getAsVector(&local_40,in_RSI);
        std::
        make_unique<std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &stack0xffffffffffffffd8);
        std::
        unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
        ::operator=(&in_RSI->sp_elements,
                    (unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                     *)&stack0xffffffffffffffd8);
        std::
        unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
        ::~unique_ptr((unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                       *)&stack0xffffffffffffffd8);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_40);
      }
      std::
      unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
      ::operator->(&in_RSI->sp_elements);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::crend
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this);
    }
    else {
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::crend
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this);
    }
  }
  return (const_reverse_iterator)
         (__normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
          )this;
}

Assistant:

Array::const_reverse_iterator
Array::crend()
{
    if (auto a = as<QPDF_Array>()) {
        if (!a->sp) {
            return a->elements.crend();
        }
        if (!sp_elements) {
            sp_elements = std::make_unique<std::vector<QPDFObjectHandle>>(getAsVector());
        }
        return sp_elements->crend();
    }
    return {};
}